

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O2

size_t __thiscall
axl::enc::CharCodec::decode_utf16
          (CharCodec *this,String_utf16 *string,void *p0,size_t size,utf32_t replacement)

{
  size_t sVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  DecoderState state;
  utf16_t buffer [256];
  
  sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::clear(string);
  state = 0;
  pvVar2 = (void *)(size + (long)p0);
  for (; p0 < pvVar2; p0 = (void *)((long)p0 + auVar3._8_8_)) {
    auVar3 = (**(code **)(*(long *)this + 0x90))
                       (this,&state,buffer,0x100,p0,(long)pvVar2 - (long)p0,replacement);
    if (auVar3._8_8_ == 0) break;
    sVar1 = sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::append
                      (string,buffer,auVar3._0_8_);
    if (sVar1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
  }
  return (string->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length;
}

Assistant:

size_t
CharCodec::decode_utf16(
	sl::String_utf16* string,
	const void* p0,
	size_t size,
	utf32_t replacement
) {
	string->clear();

	DecoderState state = 0;
	const char* p = (const char*)p0;
	const char* end = p + size;
	while (p < end) {
		utf16_t buffer[DecodeBufferLength];
		ConvertLengthResult result = decode_utf16(
			&state,
			buffer,
			countof(buffer),
			p,
			end - p,
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t length = string->append(buffer, result.m_dstLength);
		if (length == -1)
			return -1;

		p += result.m_srcLength;
	}

	return string->getLength();
}